

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS ref_iso_signed_distance(REF_GRID ref_grid,REF_DBL *field,REF_DBL *distance)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_CELL local_1b8;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT candidate;
  REF_INT item;
  REF_INT node;
  REF_LIST ref_list;
  REF_DBL scale;
  REF_DBL dist;
  REF_DBL radius;
  REF_DBL center [3];
  int local_128;
  int local_124;
  REF_INT cand [27];
  REF_INT nodes [27];
  int local_44;
  REF_CELL pRStack_40;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_SEARCH ref_search;
  REF_GRID iso_grid;
  REF_DBL *distance_local;
  REF_DBL *field_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)0x0;
  ref_list = (REF_LIST)0x3ff0000002af31dc;
  iso_grid = (REF_GRID)distance;
  distance_local = field;
  field_local = (REF_DBL *)ref_grid;
  uVar1 = ref_iso_insert((REF_GRID *)&ref_search,ref_grid,field,0,(REF_DBL *)0x0,(REF_DBL **)0x0);
  if (uVar1 == 0) {
    if (*(int *)(field_local + 0x21) == 0) {
      pRStack_40 = (REF_CELL)ref_search->pos;
    }
    else {
      pRStack_40 = (REF_CELL)ref_search->item;
    }
    uVar1 = ref_search_create((REF_SEARCH *)&ref_cell,pRStack_40->n);
    if (uVar1 == 0) {
      for (local_44 = 0; local_44 < pRStack_40->max; local_44 = local_44 + 1) {
        RVar2 = ref_cell_nodes(pRStack_40,local_44,cand + 0x1a);
        if (RVar2 == 0) {
          if (*(int *)(field_local + 0x21) == 0) {
            uVar1 = ref_node_bounding_sphere
                              (*(REF_NODE *)&ref_search->empty,cand + 0x1a,3,&radius,&dist);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x163,"ref_iso_signed_distance",(ulong)uVar1,"b");
              return uVar1;
            }
          }
          else {
            uVar1 = ref_node_bounding_sphere
                              (*(REF_NODE *)&ref_search->empty,cand + 0x1a,2,&radius,&dist);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x15f,"ref_iso_signed_distance",(ulong)uVar1,"b");
              return uVar1;
            }
          }
          uVar1 = ref_search_insert((REF_SEARCH)ref_cell,local_44,&radius,(double)ref_list * dist);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x165,"ref_iso_signed_distance",(ulong)uVar1,"ins");
            return uVar1;
          }
        }
      }
      uVar1 = ref_list_create((REF_LIST *)&item);
      if (uVar1 == 0) {
        for (candidate = 0; candidate < *(int *)((long)field_local[1] + 4);
            candidate = candidate + 1) {
          if (((-1 < candidate) && (candidate < *(int *)((long)field_local[1] + 4))) &&
             (-1 < *(long *)(*(long *)((long)field_local[1] + 0x10) + (long)candidate * 8))) {
            iso_grid->cell[(long)candidate + -2] = (REF_CELL)0x6974e718d7d7625a;
            uVar1 = ref_search_nearest_candidates
                              ((REF_SEARCH)ref_cell,_item,
                               (REF_DBL *)
                               (*(long *)((long)field_local[1] + 0x38) + (long)(candidate * 0xf) * 8
                               ));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x16d,"ref_iso_signed_distance",(ulong)uVar1,"candidates");
              return uVar1;
            }
            for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < _item->n;
                ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
              uVar1 = ref_cell_nodes(pRStack_40,_item->value[ref_private_macro_code_rss],&local_128)
              ;
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x170,"ref_iso_signed_distance",(ulong)uVar1,"cell");
                return uVar1;
              }
              if (*(int *)(field_local + 0x21) == 0) {
                uVar1 = ref_search_distance3
                                  ((REF_DBL *)
                                   (*(long *)(*(long *)&ref_search->empty + 0x38) +
                                   (long)(local_128 * 0xf) * 8),
                                   (REF_DBL *)
                                   (*(long *)(*(long *)&ref_search->empty + 0x38) +
                                   (long)(local_124 * 0xf) * 8),
                                   (REF_DBL *)
                                   (*(long *)(*(long *)&ref_search->empty + 0x38) +
                                   (long)(cand[0] * 0xf) * 8),
                                   (REF_DBL *)
                                   (*(long *)((long)field_local[1] + 0x38) +
                                   (long)(candidate * 0xf) * 8),&scale);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x17d,"ref_iso_signed_distance",(ulong)uVar1,"dist3");
                  return uVar1;
                }
              }
              else {
                uVar1 = ref_search_distance2
                                  ((REF_DBL *)
                                   (*(long *)(*(long *)&ref_search->empty + 0x38) +
                                   (long)(local_128 * 0xf) * 8),
                                   (REF_DBL *)
                                   (*(long *)(*(long *)&ref_search->empty + 0x38) +
                                   (long)(local_124 * 0xf) * 8),
                                   (REF_DBL *)
                                   (*(long *)((long)field_local[1] + 0x38) +
                                   (long)(candidate * 0xf) * 8),&scale);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x176,"ref_iso_signed_distance",(ulong)uVar1,"dist2");
                  return uVar1;
                }
              }
              if (scale <= (double)iso_grid->cell[(long)candidate + -2]) {
                local_1b8 = (REF_CELL)scale;
              }
              else {
                local_1b8 = iso_grid->cell[(long)candidate + -2];
              }
              iso_grid->cell[(long)candidate + -2] = local_1b8;
            }
            if (distance_local[candidate] <= 0.0 && distance_local[candidate] != 0.0) {
              iso_grid->cell[(long)candidate + -2] =
                   (REF_CELL)((ulong)iso_grid->cell[(long)candidate + -2] ^ 0x8000000000000000);
            }
            uVar1 = ref_list_erase(_item);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x185,"ref_iso_signed_distance",(ulong)uVar1,"reset list");
              return uVar1;
            }
          }
        }
        uVar1 = ref_list_free(_item);
        if (uVar1 == 0) {
          uVar1 = ref_search_free((REF_SEARCH)ref_cell);
          if (uVar1 == 0) {
            ref_grid_local._4_4_ = ref_grid_free((REF_GRID)ref_search);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x18a,"ref_iso_signed_distance",(ulong)ref_grid_local._4_4_,"iso free");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x188,"ref_iso_signed_distance",(ulong)uVar1,"free search");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x187,"ref_iso_signed_distance",(ulong)uVar1,"free list");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x167
               ,"ref_iso_signed_distance",(ulong)uVar1,"create list");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x15a,
             "ref_iso_signed_distance",(ulong)uVar1,"create search");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x153,
           "ref_iso_signed_distance",(ulong)uVar1,"iso");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                           REF_DBL *distance) {
  REF_GRID iso_grid;
  REF_SEARCH ref_search = NULL;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cand[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, dist;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_LIST ref_list;
  REF_INT node, item, candidate;

  RSS(ref_iso_insert(&iso_grid, ref_grid, field, 0, NULL, NULL), "iso");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(iso_grid);
  } else {
    ref_cell = ref_grid_tri(iso_grid);
  }
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 2, center,
                                   &radius),
          "b");
    } else {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 3, center,
                                   &radius),
          "b");
    }
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
  }
  RSS(ref_list_create(&ref_list), "create list");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    distance[node] = REF_DBL_MAX;
    RSS(ref_search_nearest_candidates(
            ref_search, ref_list,
            ref_node_xyz_ptr(ref_grid_node(ref_grid), node)),
        "candidates");
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, cand), "cell");
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_search_distance2(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist2");
      } else {
        RSS(ref_search_distance3(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[2]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist3");
      }
      distance[node] = MIN(distance[node], dist);
    }

    /* sign distanace */
    if (0.0 > field[node]) distance[node] = -distance[node];

    RSS(ref_list_erase(ref_list), "reset list");
  }
  RSS(ref_list_free(ref_list), "free list");
  RSS(ref_search_free(ref_search), "free search");

  RSS(ref_grid_free(iso_grid), "iso free");

  return REF_SUCCESS;
}